

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O0

void ares_hosts_entry_destroy(ares_hosts_entry_t *entry)

{
  ares_hosts_entry_t *entry_local;
  
  if (entry != (ares_hosts_entry_t *)0x0) {
    if (entry->refcnt != 0) {
      entry->refcnt = entry->refcnt - 1;
    }
    if (entry->refcnt == 0) {
      ares_llist_destroy(entry->hosts);
      ares_llist_destroy(entry->ips);
      ares_free(entry);
    }
  }
  return;
}

Assistant:

static void ares_hosts_entry_destroy(ares_hosts_entry_t *entry)
{
  if (entry == NULL) {
    return;
  }

  /* Honor reference counting */
  if (entry->refcnt != 0) {
    entry->refcnt--;
  }

  if (entry->refcnt > 0) {
    return;
  }

  ares_llist_destroy(entry->hosts);
  ares_llist_destroy(entry->ips);
  ares_free(entry);
}